

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O1

bool __thiscall
QuantLib::EndCriteria::operator()
          (EndCriteria *this,size_t iteration,size_t *statStateIterations,bool positiveOptimization,
          RealType fold,RealType param_5,RealType fnew,RealType normgnew,Type *ecType)

{
  size_t sVar1;
  bool bVar2;
  Type TVar3;
  
  bVar2 = true;
  TVar3 = MaxIterations;
  if (iteration < this->maxIterations_) {
    if (this->functionEpsilon_ <= ABS(fnew - fold)) {
      *statStateIterations = 0;
    }
    else {
      sVar1 = *statStateIterations;
      *statStateIterations = sVar1 + 1;
      TVar3 = StationaryFunctionValue;
      if (this->maxStationaryStateIterations_ < sVar1 + 1) goto LAB_001f764f;
    }
    if ((!positiveOptimization) ||
       (TVar3 = StationaryFunctionAccuracy, this->functionEpsilon_ <= fnew)) {
      bVar2 = normgnew < this->gradientNormEpsilon_;
      TVar3 = ZeroGradientNorm;
      if (!bVar2) {
        return bVar2;
      }
    }
  }
LAB_001f764f:
  *ecType = TVar3;
  return bVar2;
}

Assistant:

bool EndCriteria::operator()(const size_t iteration,
                               size_t& statStateIterations,
                               const bool positiveOptimization,
                               const RealType fold,
                               const RealType,  // normgold,
                               const RealType fnew, const RealType normgnew,
                               EndCriteria::Type& ecType) const {
    return checkMaxIterations(iteration, ecType) ||
           checkStationaryFunctionValue(fold, fnew, statStateIterations,
                                        ecType) ||
           checkStationaryFunctionAccuracy(fnew, positiveOptimization,
                                           ecType) ||
           checkZeroGradientNorm(normgnew, ecType);
  }